

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pump.c
# Opt level: O3

void read_sockets_close_cb_cold_1(void)

{
  uint64_t uVar1;
  char *pcVar2;
  
  uv_update_time(loop);
  uVar1 = uv_now(loop);
  pcVar2 = "tcp";
  if (type != '\0') {
    pcVar2 = "pipe";
  }
  fprintf(_stderr,"%s_pump%d_server: %.1f gbit/s\n",
          ((double)nrecv_total * 9.313225746154785e-10 * 8.0) /
          ((double)(long)(uVar1 - start_time) / 1000.0),pcVar2,(ulong)(uint)max_read_sockets);
  fflush(_stderr);
  uv_close((uv_handle_t *)server,(uv_close_cb)0x0);
  return;
}

Assistant:

static void read_show_stats(void) {
  int64_t diff;

  uv_update_time(loop);
  diff = uv_now(loop) - start_time;

  fprintf(stderr, "%s_pump%d_server: %.1f gbit/s\n",
          type == TCP ? "tcp" : "pipe",
          max_read_sockets,
          gbit(nrecv_total, diff));
  fflush(stderr);
}